

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,big_decimal_fp *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  int iVar1;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  basic_appender<char> bVar8;
  uint uVar9;
  size_t n;
  int iVar10;
  int iVar11;
  long lVar12;
  digit_grouping<char> *this;
  ulong uVar13;
  locale_ref in_stack_fffffffffffffee8;
  char local_10e;
  char zero;
  bool pointy;
  undefined3 uStack_10b;
  int significand_size;
  sign s_local;
  ulong local_100;
  basic_appender<char> local_f8;
  char *significand;
  sign local_e8;
  int exp;
  locale_ref local_e0;
  char *local_d8;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined4 uStack_84;
  char **local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  digit_grouping<char> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_class_24_3_3ccdf9fd use_exp_format;
  
  significand = f->significand;
  iVar6 = f->significand_size;
  local_100 = (ulong)((iVar6 + 1) - (uint)(s == none));
  zero = '0';
  cVar3 = '.';
  significand_size = iVar6;
  s_local = s;
  local_f8.container = out.container;
  local_e8 = s;
  local_d8 = significand;
  if (((specs->super_basic_specs).data_ & 0x4000) != 0) {
    cVar3 = decimal_point_impl<char>(in_stack_fffffffffffffee8);
  }
  iVar11 = f->exponent;
  iVar10 = iVar6 + iVar11 + -1;
  use_exp_format.specs.super_basic_specs = specs->super_basic_specs;
  use_exp_format.specs.width = specs->width;
  use_exp_format.specs.precision = specs->precision;
  local_10e = cVar3;
  local_e0.locale_ = loc.locale_;
  use_exp_format.output_exp = iVar10;
  use_exp_format.exp_upper = exp_upper;
  bVar4 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::big_decimal_fp,_fmt::v11::detail::digit_grouping<char>_>
          ::anon_class_24_3_3ccdf9fd::operator()(&use_exp_format);
  uVar2 = write._24_8_;
  if (bVar4) {
    iVar11 = iVar11 + iVar6;
    uVar5 = (specs->super_basic_specs).data_;
    if ((uVar5 >> 0xd & 1) == 0) {
      uVar7 = 0;
      uVar13 = local_100;
      if (iVar6 == 1) {
        cVar3 = '\0';
      }
    }
    else {
      uVar9 = specs->precision - iVar6;
      uVar7 = 0;
      if (0 < (int)uVar9) {
        uVar7 = (ulong)uVar9;
      }
      uVar13 = local_100 + uVar7;
    }
    iVar1 = 1 - iVar11;
    if (0 < iVar11) {
      iVar1 = iVar10;
    }
    lVar12 = 2;
    if (99 < iVar1) {
      lVar12 = (ulong)(999 < iVar1) + 3;
    }
    n = (3 - (ulong)(cVar3 == '\0')) + uVar13 + lVar12;
    write.s = local_e8;
    write.significand = local_d8;
    write.decimal_point = cVar3;
    write.significand_size = iVar6;
    write._24_5_ = CONCAT14('0',(int)uVar7);
    write._30_2_ = SUB82(uVar2,6);
    write._24_8_ = CONCAT26(write._30_2_,CONCAT15(((uVar5 >> 0xc & 1) == 0) << 5,write._24_5_)) |
                   0x450000000000;
    write.output_exp = iVar10;
    if (0 < specs->width) {
      bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        (local_f8,specs,n,&write);
      return (basic_appender<char>)bVar8.container;
    }
    bVar8 = reserve<char>(local_f8,n);
    bVar8 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::big_decimal_fp,_fmt::v11::detail::digit_grouping<char>_>
            ::anon_class_40_8_fd1bf2f9::operator()(&write,bVar8.container);
    return (basic_appender<char>)bVar8.container;
  }
  iVar11 = f->exponent;
  iVar10 = iVar6 + iVar11;
  exp = iVar10;
  if (-1 < (long)iVar11) {
    lVar12 = (long)iVar11 + local_100;
    _pointy = specs->precision - iVar10;
    uVar5 = (specs->super_basic_specs).data_;
    if ((uVar5 >> 0xd & 1) != 0) {
      lVar12 = lVar12 + 1;
      if ((uVar5 & 7) == 2 || 0 < (int)_pointy) {
        if (0 < (int)_pointy) {
          lVar12 = lVar12 + (ulong)_pointy;
        }
      }
      else {
        _pointy = 0;
      }
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&num_zeros,local_e0,(bool)((byte)(uVar5 >> 0xe) & 1));
    uVar5 = digit_grouping<char>::count_separators((digit_grouping<char> *)&num_zeros,iVar10);
    write._0_8_ = &s_local;
    write.significand = (char *)&significand;
    write._16_8_ = &significand_size;
    write._24_8_ = f;
    write._32_8_ = (digit_grouping<char> *)&num_zeros;
    bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_>
                      (local_f8,specs,lVar12 + (ulong)uVar5,(anon_class_72_9_eb40e20e *)&write);
    this = (digit_grouping<char> *)&num_zeros;
LAB_001f871c:
    digit_grouping<char>::~digit_grouping(this);
    return (basic_appender<char>)bVar8.container;
  }
  if (0 < iVar10) {
    uVar5 = (specs->super_basic_specs).data_;
    uVar9 = specs->precision - iVar6 & (int)(uVar5 << 0x12) >> 0x1f;
    _pointy = uVar9;
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&write,local_e0,(bool)((byte)(uVar5 >> 0xe) & 1));
    uVar5 = digit_grouping<char>::count_separators((digit_grouping<char> *)&write,iVar10);
    uVar7 = 0;
    if (0 < (int)uVar9) {
      uVar7 = (ulong)uVar9;
    }
    _num_zeros = (pointer)&s_local;
    local_80 = &significand;
    local_78._M_allocated_capacity = (size_type)&significand_size;
    local_78._8_8_ = &exp;
    local_68._M_p = &local_10e;
    local_58._M_allocated_capacity = (size_type)&pointy;
    local_58._8_8_ = &zero;
    local_60 = (digit_grouping<char> *)&write;
    bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_>
                      (local_f8,specs,(ulong)uVar5 + uVar7 + local_100 + 1,
                       (anon_class_64_8_085c650e *)&num_zeros);
    this = (digit_grouping<char> *)&write;
    goto LAB_001f871c;
  }
  iVar11 = -iVar10;
  num_zeros = iVar11;
  if (iVar6 == 0) {
    iVar6 = specs->precision;
    if (SBORROW4(iVar6,iVar11) != iVar6 + iVar10 < 0 && -1 < iVar6) {
      num_zeros = iVar6;
      iVar11 = iVar6;
    }
    if (iVar11 == 0) {
      uVar5 = (specs->super_basic_specs).data_ & 0x2000;
      _pointy = CONCAT31(uStack_10b,(char)(uVar5 >> 0xd));
      iVar6 = 2 - (uint)(uVar5 == 0);
      goto LAB_001f876f;
    }
  }
  _pointy = CONCAT31(uStack_10b,1);
  iVar6 = 2;
LAB_001f876f:
  write._0_8_ = &s_local;
  write.significand = &pointy;
  write._16_8_ = &local_10e;
  write._24_8_ = &num_zeros;
  write._32_8_ = &zero;
  bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_>
                    (local_f8,specs,(uint)(iVar11 + iVar6) + local_100,
                     (anon_class_56_7_88befd79 *)&write);
  return (basic_appender<char>)bVar8.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}